

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

bool jsoncons::jsonpath::detail::
     is_false<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *val)

{
  bool bVar1;
  string_view_type sVar2;
  
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(val);
  if ((bVar1) &&
     (bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(val), bVar1
     )) {
    return true;
  }
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(val);
  if ((bVar1) &&
     (bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(val), bVar1
     )) {
    return true;
  }
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(val);
  if ((bVar1) &&
     (sVar2 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                        (val), sVar2._M_len == 0)) {
    return true;
  }
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_bool(val);
  if ((bVar1) &&
     (bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool(val),
     !bVar1)) {
    return true;
  }
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null(val);
  return bVar1;
}

Assistant:

bool is_false(const Json& val)
    {
        return ((val.is_array() && val.empty()) ||
                 (val.is_object() && val.empty()) ||
                 (val.is_string() && val.as_string_view().empty()) ||
                 (val.is_bool() && !val.as_bool()) ||
                 val.is_null());
    }